

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroFormalArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroFormalArgumentSyntax,slang::syntax::MacroFormalArgumentSyntax_const&>
          (BumpAllocator *this,MacroFormalArgumentSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  MacroArgumentDefaultSyntax *pMVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  MacroFormalArgumentSyntax *pMVar10;
  
  pMVar10 = (MacroFormalArgumentSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->name).kind;
  uVar7 = (args->name).field_0x2;
  NVar8.raw = (args->name).numFlags.raw;
  uVar9 = (args->name).rawLen;
  pIVar3 = (args->name).info;
  pMVar4 = args->defaultValue;
  (pMVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pMVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pMVar10->super_SyntaxNode).parent = pSVar1;
  (pMVar10->super_SyntaxNode).previewNode = pSVar2;
  (pMVar10->name).kind = TVar6;
  (pMVar10->name).field_0x2 = uVar7;
  (pMVar10->name).numFlags = (NumericTokenFlags)NVar8.raw;
  (pMVar10->name).rawLen = uVar9;
  (pMVar10->name).info = pIVar3;
  pMVar10->defaultValue = pMVar4;
  return pMVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }